

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void prvTidyResetTags(TidyDocImpl *doc)

{
  Dict *pDVar1;
  TidyTagImpl *tags;
  Dict *np;
  TidyDocImpl *doc_local;
  
  pDVar1 = prvTidyLookupTagDef(TidyTag_A);
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->parser = prvTidyParseBlock;
    pDVar1->model = 0x20018;
  }
  pDVar1 = prvTidyLookupTagDef(TidyTag_CAPTION);
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->parser = prvTidyParseBlock;
  }
  pDVar1 = prvTidyLookupTagDef(TidyTag_OBJECT);
  if (pDVar1 != (Dict *)0x0) {
    pDVar1->model = 0x11810;
  }
  tagsEmptyHash(doc,&doc->tags);
  return;
}

Assistant:

void TY_(ResetTags)( TidyDocImpl *doc )
{
    Dict *np = (Dict *)TY_(LookupTagDef)( TidyTag_A );
    TidyTagImpl* tags = &doc->tags;
    if (np) 
    {
        np->parser = TY_(ParseBlock);
        np->model  = (CM_INLINE|CM_BLOCK|CM_MIXED);
    }
    np = (Dict *)TY_(LookupTagDef)( TidyTag_CAPTION );
    if (np)
    {
        np->parser = TY_(ParseBlock);
    }

    np = (Dict *)TY_(LookupTagDef)( TidyTag_OBJECT );
    if (np)
    {
        np->model = (CM_OBJECT|CM_IMG|CM_INLINE|CM_PARAM); /* reset */
    }
#if ELEMENT_HASH_LOOKUP
    tagsEmptyHash( doc, tags ); /* not sure this is really required, but to be sure */
#endif
}